

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  byte bVar1;
  FieldType field_type;
  int number;
  uint32_t uVar2;
  Descriptor *v2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  bool bVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage local_50 [2];
  
  bVar1 = field->field_0x1;
  bVar5 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar5) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      RepeatedFieldData();
LAB_001fa8b2:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xd6e,
                 "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
                );
      str._M_str = "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ";
      str._M_len = 0x3e;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(local_50,str)
      ;
      str_00._M_str = "the actual field type (for enums T should be the generated enum ";
      str_00._M_len = 0x40;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (local_50,str_00);
      str_01._M_str = "type or int32_t).";
      str_01._M_len = 0x11;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (local_50,str_01);
      if ((char)cpp_type != '\0') goto LAB_001fa94e;
    }
    else {
      if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == cpp_type) {
        cpp_type = 0;
      }
      else {
        cpp_type = (CppType)(cpp_type != CPPTYPE_INT32 ||
                            *(CppType *)
                             (FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
                            CPPTYPE_ENUM);
      }
      if ((char)cpp_type != '\0') goto LAB_001fa8b2;
    }
    if (message_type == (Descriptor *)0x0) {
LAB_001fa833:
      if ((field->field_0x1 & 8) == 0) {
        pvVar3 = MutableRawNonOneofImpl(this,message,field);
      }
      else {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        field_type = field->type_;
        bVar5 = FieldDescriptor::is_packed(field);
        pvVar3 = internal::ExtensionSet::MutableRawRepeatedField
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            number,field_type,bVar5,field);
      }
      return pvVar3;
    }
    v2 = FieldDescriptor::message_type(field);
    if (v2 == message_type) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (message_type,v2,"message_type == field->message_type()");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) goto LAB_001fa833;
  }
  else {
    RepeatedFieldData();
  }
  RepeatedFieldData();
LAB_001fa94e:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50);
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}